

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  uint *puVar1;
  ushort *puVar2;
  int32_t *piVar3;
  int64_t *piVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  int32_t iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint64_t uVar19;
  long lVar20;
  byte bVar21;
  int iVar22;
  uint16_t *m_00;
  char cVar23;
  uint16_t *puVar24;
  ulong unaff_RBP;
  secp256k1_modinv32_modinfo *modinfo;
  secp256k1_modinv64_modinfo *psVar25;
  uint uVar26;
  secp256k1_modinv64_modinfo *a;
  secp256k1_modinv64_signed62 *psVar27;
  secp256k1_modinv64_signed62 *psVar28;
  uint16_t *out_00;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  secp256k1_modinv64_modinfo *out_01;
  uint uVar33;
  int iVar34;
  code *pcVar35;
  int64_t iVar36;
  int iVar37;
  bool bVar38;
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  int iStack_27c;
  secp256k1_modinv32_trans2x2 sStack_278;
  undefined8 uStack_268;
  secp256k1_modinv32_signed30 sStack_260;
  int iStack_234;
  secp256k1_modinv32_signed30 sStack_230;
  uint16_t *puStack_208;
  ulong uStack_200;
  code *pcStack_1f8;
  secp256k1_modinv32_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_signed62 sStack_1d0;
  ulong uStack_1a8;
  secp256k1_modinv64_modinfo sStack_1a0;
  ushort auStack_170 [20];
  uint16_t *puStack_148;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  undefined8 uStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv32_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar25 = &local_e8;
  a = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar16 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar16 & 0xff) / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((in[uVar16 >> 4] >> (uVar16 & 0xf) & 1) != 0) <<
                        ((char)(uVar16 / 0x1e) * -0x1e + (char)uVar16 & 0x1fU);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x100);
  uVar33 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  pcVar35 = (code *)(ulong)uVar33;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  local_b8.modulus.v[5] = 0;
  local_b8.modulus.v[6] = 0;
  local_b8.modulus.v[7] = 0;
  local_b8.modulus.v[8] = 0;
  uVar16 = 0;
  do {
    modinfo = (secp256k1_modinv32_modinfo *)(ulong)mod[uVar16 >> 4];
    piVar3 = local_b8.modulus.v + (uVar16 & 0xff) / 0x1e;
    *piVar3 = *piVar3 | (uint)((mod[uVar16 >> 4] >> (uVar16 & 0xf) & 1) != 0) <<
                        ((char)(uVar16 / 0x1e) * -0x1e + (char)uVar16 & 0x1fU);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x100);
  iVar15 = local_b8.modulus.v[0];
  out_01 = (secp256k1_modinv64_modinfo *)(long)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x16bf02;
  uVar19 = modinv2p64((uint64_t)out_01);
  local_b8.modulus_inv30 = (uint)uVar19 & 0x3fffffff;
  uVar16 = iVar15 * (uint)uVar19 & 0x3fffffff;
  uVar30 = (ulong)uVar16;
  if (uVar16 != 1) goto LAB_0016c2ff;
  if (uVar33 == 0) {
LAB_0016c064:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar16 = 0;
    do {
      puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar16 & 0xff) / 0x1e) * 4);
      *puVar1 = *puVar1 | (uint)((in[uVar16 >> 4] >> (uVar16 & 0xf) & 1) != 0) <<
                          ((char)(uVar16 / 0x1e) * -0x1e + (char)uVar16 & 0x1fU);
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x100);
    local_88.modulus_inv62 = (uint64_t)mod;
    iVar17 = 0x10;
    do {
      uVar32 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar30 = uVar32 >> 0x1d;
      uVar32 = uVar32 >> 0x3d;
      iVar34 = local_b8.modulus.v[uVar32];
      if (iVar34 < 1) {
        if (iVar34 < 0) {
          uVar30 = uVar30 + 0x100000000 >> 0x20;
          uVar16 = local_b8.modulus.v[uVar30];
          mod = (uint16_t *)(ulong)uVar16;
          if (0x3ffffffe < (int)uVar16) {
            local_b8.modulus.v[uVar32] = iVar34 + 0x40000000;
            uVar16 = uVar16 - 1;
            goto LAB_0016c139;
          }
        }
      }
      else {
        uVar30 = uVar30 + 0x100000000 >> 0x20;
        uVar16 = local_b8.modulus.v[uVar30];
        mod = (uint16_t *)(ulong)uVar16;
        if ((int)uVar16 < 0x40000000) {
          local_b8.modulus.v[uVar32] = iVar34 + -0x40000000;
          uVar16 = uVar16 + 1;
LAB_0016c139:
          mod = (uint16_t *)(ulong)uVar16;
          local_b8.modulus.v[uVar30] = uVar16;
        }
      }
      uVar31 = secp256k1_test_state[1] << 0x11;
      uVar32 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar30 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar32;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar30;
      secp256k1_test_state[2] = uVar32 ^ uVar31;
      secp256k1_test_state[3] = uVar30 << 0x2d | uVar30 >> 0x13;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    unaff_RBP = (ulong)(uVar33 != 0);
    mod = (uint16_t *)CONCAT71((int7)((ulong)mod >> 8),1);
    uVar30 = 0x88888889;
    while( true ) {
      cVar23 = (char)mod;
      pcVar35 = secp256k1_modinv32_var;
      if (cVar23 != '\0') {
        pcVar35 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x16c1d6;
      (*pcVar35)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar16 = 0;
      do {
        out[uVar16 >> 4] =
             out[uVar16 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + (ulong)((uVar16 & 0xff) / 0x1e) * 4) >>
                       uVar16 % 0x1e & 1) != 0) << ((byte)uVar16 & 0xf);
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x100);
      out_01 = &local_88;
      pcStack_f0 = (code *)0x16c23b;
      modinfo = (secp256k1_modinv32_modinfo *)out;
      mulmod256((uint16_t *)out_01,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar33 != 0)) break;
      lVar20 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar20 * 2) != 0) {
          pcStack_f0 = (code *)0x16c2f5;
          test_modinv32_uint16_cold_4();
          goto LAB_0016c2f5;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      pcStack_f0 = (code *)0x16c26b;
      (*pcVar35)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar16 = 0;
      do {
        uVar26 = *(uint *)((long)local_e8.modulus.v + (ulong)((uVar16 & 0xff) / 0x1e) * 4);
        modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
        uVar26 = (uint)((uVar26 >> uVar16 % 0x1e & 1) != 0) << ((byte)uVar16 & 0xf);
        out_01 = (secp256k1_modinv64_modinfo *)(ulong)uVar26;
        puVar2 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar16 >> 4) * 2);
        *puVar2 = *puVar2 | (ushort)uVar26;
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x100);
      lVar20 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar20 * 2) != in[lVar20]) goto LAB_0016c2f5;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      mod = (uint16_t *)0x0;
      if (cVar23 == '\0') {
        return;
      }
    }
    goto LAB_0016c2fa;
  }
  pcStack_f0 = (code *)0x16bf3a;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar16 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar16 & 0xff) / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar16 >> 4) * 2) >>
                                (uVar16 & 0xf) & 1) != 0) <<
                        ((char)(uVar16 / 0x1e) * -0x1e + (char)uVar16 & 0x1fU);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16bfa6;
  uVar16 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if (1 < uVar16) goto LAB_0016c304;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x16bfdf;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar16 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar16 & 0xff) / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar16 >> 4) * 2) >>
                                (uVar16 & 0xf) & 1) != 0) <<
                        ((char)(uVar16 / 0x1e) * -0x1e + (char)uVar16 & 0x1fU);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16c04b;
  iVar17 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if ((iVar17 == 0) || (iVar17 == 1 - (*mod & 2))) goto LAB_0016c064;
LAB_0016c309:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = pcVar35;
  uStack_110 = uVar30;
  puStack_118 = mod;
  psVar27 = &sStack_1d0;
  psVar28 = &sStack_1d0;
  sStack_1d0.v[0] = 0;
  sStack_1d0.v[1] = 0;
  sStack_1d0.v[2] = 0;
  sStack_1d0.v[3] = 0;
  sStack_1d0.v[4] = 0;
  uVar30 = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar30 >> 1;
    sStack_1d0.v[((byte)((uVar30 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
         sStack_1d0.v[((byte)((uVar30 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
         (ulong)((*(ushort *)((long)(modinfo->modulus).v + (uVar30 >> 4 & 0xfffffff) * 2) >>
                  ((uint)uVar30 & 0xf) & 1) != 0) <<
         ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar30 &
         0x3fU);
    uVar30 = uVar30 + 1;
  } while ((int)uVar30 != 0x100);
  uStack_1a8 = sStack_1d0.v[1] | sStack_1d0.v[0] | sStack_1d0.v[2] | sStack_1d0.v[3] |
               sStack_1d0.v[4];
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar25 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)psVar25 >> 1;
    piVar4 = sStack_1a0.modulus.v + ((byte)(((ulong)psVar25 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar4 = *piVar4 | (ulong)((m_00[(ulong)psVar25 >> 4 & 0xfffffff] >> ((uint)psVar25 & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar25 & 0x3fU);
    iVar36 = sStack_1a0.modulus.v[0];
    psVar25 = (secp256k1_modinv64_modinfo *)((long)(psVar25->modulus).v + 1);
  } while ((int)psVar25 != 0x100);
  pcVar35 = (code *)0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x16c439;
  out_00 = (uint16_t *)sStack_1a0.modulus.v[0];
  uVar19 = modinv2p64(sStack_1a0.modulus.v[0]);
  sStack_1a0.modulus_inv62 = uVar19 & 0x3fffffffffffffff;
  uVar30 = iVar36 * uVar19 & 0x3fffffffffffffff;
  puVar24 = m_00;
  if (uVar30 == 1) {
    if (uStack_1a8 == 0) {
LAB_0016c5b1:
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar30 = 0;
      do {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar30 >> 1;
        sStack_1d0.v[((byte)((uVar30 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
             sStack_1d0.v[((byte)((uVar30 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
             (ulong)((*(ushort *)((long)(modinfo->modulus).v + (uVar30 >> 4 & 0xfffffff) * 2) >>
                      ((uint)uVar30 & 0xf) & 1) != 0) <<
             ((char)(SUB164(auVar11 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar30 &
             0x3fU);
        uVar30 = uVar30 + 1;
      } while ((int)uVar30 != 0x100);
      puStack_148 = m_00;
      iVar17 = 8;
      do {
        uVar30 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0];
        uVar32 = uVar30 >> 0x1e;
        uVar30 = uVar30 >> 0x3e;
        lVar20 = sStack_1a0.modulus.v[uVar30];
        if (lVar20 < 1) {
          if (lVar20 < 0) {
            uVar32 = uVar32 + 0x100000000 >> 0x20;
            lVar5 = sStack_1a0.modulus.v[uVar32];
            if (-0x4000000000000000 < lVar5) {
              lVar20 = lVar20 + 0x4000000000000000;
              sStack_1a0.modulus.v[uVar30] = lVar20;
              iVar36 = lVar5 + -1;
              goto LAB_0016c6a5;
            }
          }
        }
        else {
          uVar32 = uVar32 + 0x100000000 >> 0x20;
          lVar5 = sStack_1a0.modulus.v[uVar32];
          if (lVar5 < 0x4000000000000000) {
            lVar20 = lVar20 + -0x4000000000000000;
            sStack_1a0.modulus.v[uVar30] = lVar20;
            iVar36 = lVar5 + 1;
LAB_0016c6a5:
            sStack_1a0.modulus.v[uVar32] = iVar36;
          }
        }
        uVar31 = secp256k1_test_state[1] << 0x11;
        uVar32 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar30 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar32;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar30;
        secp256k1_test_state[2] = uVar32 ^ uVar31;
        secp256k1_test_state[3] = uVar30 << 0x2d | uVar30 >> 0x13;
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
      bVar38 = uStack_1a8 != 0;
      puVar24 = (uint16_t *)(ulong)bVar38;
      uVar30 = CONCAT71((int7)((ulong)lVar20 >> 8),1);
      while( true ) {
        cVar23 = (char)uVar30;
        pcVar35 = secp256k1_modinv64_var;
        if (cVar23 != '\0') {
          pcVar35 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x16c757;
        (*pcVar35)(&sStack_1d0);
        (a->modulus).v[2] = 0;
        (a->modulus).v[3] = 0;
        (a->modulus).v[0] = 0;
        (a->modulus).v[1] = 0;
        uVar32 = 0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar32 >> 1;
          puVar2 = (ushort *)((long)(a->modulus).v + (uVar32 >> 4 & 0xfffffff) * 2);
          *puVar2 = *puVar2 | (ushort)(((ulong)sStack_1d0.v
                                               [((byte)((uVar32 & 0xffffffff) >> 1) & 0x7f) / 0x1f]
                                        >> ((ulong)((SUB164(auVar12 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar32) & 0x3f) & 1) != 0) <<
                              ((byte)uVar32 & 0xf);
          uVar32 = uVar32 + 1;
        } while ((int)uVar32 != 0x100);
        out_00 = auStack_170;
        pcStack_1d8 = (code *)0x16c7c8;
        psVar25 = a;
        mulmod256(out_00,(uint16_t *)a,(uint16_t *)modinfo,puStack_148);
        if (auStack_170[0] != bVar38) break;
        lVar20 = 1;
        do {
          if (auStack_170[lVar20] != 0) {
            pcStack_1d8 = (code *)0x16c890;
            test_modinv64_uint16_cold_4();
            goto LAB_0016c890;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        pcStack_1d8 = (code *)0x16c7f8;
        (*pcVar35)(&sStack_1d0);
        auStack_170[8] = 0;
        auStack_170[9] = 0;
        auStack_170[10] = 0;
        auStack_170[0xb] = 0;
        auStack_170[0xc] = 0;
        auStack_170[0xd] = 0;
        auStack_170[0xe] = 0;
        auStack_170[0xf] = 0;
        auStack_170[0] = 0;
        auStack_170[1] = 0;
        auStack_170[2] = 0;
        auStack_170[3] = 0;
        auStack_170[4] = 0;
        auStack_170[5] = 0;
        auStack_170[6] = 0;
        auStack_170[7] = 0;
        psVar25 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = (ulong)psVar25 >> 1;
          out_00 = (uint16_t *)
                   ((ulong)(((ulong)sStack_1d0.v
                                    [((byte)(((ulong)psVar25 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                             ((ulong)((SUB164(auVar13 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                     (int)psVar25) & 0x3f) & 1) != 0) << ((byte)psVar25 & 0xf));
          auStack_170[(ulong)psVar25 >> 4 & 0xfffffff] =
               auStack_170[(ulong)psVar25 >> 4 & 0xfffffff] | (ushort)out_00;
          psVar25 = (secp256k1_modinv64_modinfo *)((long)(psVar25->modulus).v + 1);
        } while ((int)psVar25 != 0x100);
        lVar20 = 0;
        do {
          if (auStack_170[lVar20] != *(ushort *)((long)(modinfo->modulus).v + lVar20 * 2))
          goto LAB_0016c890;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        uVar30 = 0;
        if (cVar23 == '\0') {
          return;
        }
      }
LAB_0016c895:
      pcStack_1d8 = (code *)0x16c89a;
      test_modinv64_uint16_cold_3();
      goto LAB_0016c89a;
    }
    pcStack_1d8 = (code *)0x16c473;
    mulmod256(auStack_170,(uint16_t *)modinfo,(uint16_t *)modinfo,m_00);
    sStack_1d0.v[2] = 0;
    sStack_1d0.v[3] = 0;
    sStack_1d0.v[0] = 0;
    sStack_1d0.v[1] = 0;
    sStack_1d0.v[4] = 0;
    uVar32 = 0;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar32 >> 1;
      sStack_1d0.v[((byte)((uVar32 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
           sStack_1d0.v[((byte)((uVar32 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
           (ulong)((auStack_170[uVar32 >> 4 & 0xfffffff] >> ((uint)uVar32 & 0xf) & 1) != 0) <<
           ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar32 &
           0x3fU);
      uVar32 = uVar32 + 1;
    } while ((int)uVar32 != 0x100);
    psVar25 = &sStack_1a0;
    pcStack_1d8 = (code *)0x16c4e9;
    uVar16 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar25);
    if (uVar16 < 2) {
      uStack_140 = *m_00 - 1;
      uStack_13e = *(undefined8 *)(m_00 + 1);
      uStack_128 = *(undefined8 *)(m_00 + 0xc);
      uStack_136 = (undefined6)*(undefined8 *)(m_00 + 5);
      uStack_130 = (undefined2)*(undefined8 *)(m_00 + 8);
      uStack_12e = (undefined6)((ulong)*(undefined8 *)(m_00 + 8) >> 0x10);
      pcStack_1d8 = (code *)0x16c522;
      mulmod256(auStack_170,auStack_170,&uStack_140,m_00);
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar32 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar32 >> 1;
        sStack_1d0.v[((byte)((uVar32 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
             sStack_1d0.v[((byte)((uVar32 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
             (ulong)((auStack_170[uVar32 >> 4 & 0xfffffff] >> ((uint)uVar32 & 0xf) & 1) != 0) <<
             ((char)(SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar32 &
             0x3fU);
        uVar32 = uVar32 + 1;
      } while ((int)uVar32 != 0x100);
      psVar25 = &sStack_1a0;
      pcStack_1d8 = (code *)0x16c598;
      iVar17 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar25);
      if ((iVar17 != 0) && (iVar17 != 1 - (*m_00 & 2))) goto LAB_0016c8a4;
      goto LAB_0016c5b1;
    }
  }
  else {
LAB_0016c89a:
    pcStack_1d8 = (code *)0x16c89f;
    test_modinv64_uint16_cold_1();
    psVar27 = (secp256k1_modinv64_signed62 *)out_00;
  }
  psVar28 = psVar27;
  pcStack_1d8 = (code *)0x16c8a4;
  test_modinv64_uint16_cold_6();
LAB_0016c8a4:
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar28 & 1) != 0) {
    iVar17 = 6;
    do {
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = a;
  psStack_1f0 = modinfo;
  pcStack_1f8 = pcVar35;
  uStack_200 = uVar30;
  puStack_208 = puVar24;
  sStack_260.v[8] = (int32_t)(psVar25->modulus).v[4];
  iVar36 = (psVar25->modulus).v[0];
  sStack_260.v._16_8_ = (psVar25->modulus).v[2];
  sStack_260.v._24_8_ = (psVar25->modulus).v[3];
  sStack_260.v[0] = (int)iVar36;
  sStack_260.v[1] = (int)((ulong)iVar36 >> 0x20);
  uVar14 = sStack_260.v._0_8_;
  sStack_260.v._8_8_ = (psVar25->modulus).v[1];
  sStack_230.v[8] = *(int32_t *)((long)psVar28 + 0x20);
  sStack_230.v._0_8_ = psVar28->v[0];
  sStack_230.v._8_8_ = *(undefined8 *)((long)psVar28 + 8);
  sStack_230.v._16_8_ = *(undefined8 *)((long)psVar28 + 0x10);
  sStack_230.v._24_8_ = *(undefined8 *)((long)psVar28 + 0x18);
  uVar30 = 9;
  iVar34 = -1;
  iVar17 = 0;
  sStack_260.v[0] = (int32_t)iVar36;
  uVar16 = sStack_260.v[0];
  sStack_260.v._0_8_ = uVar14;
  do {
    iVar22 = 0;
    if ((sStack_230.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_230.v[0] | 0xc0000000U) >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
      }
    }
    iVar34 = iVar34 - iVar22;
    if (iVar22 == 0x1e) {
      sStack_278.u = 0x40000000;
      iStack_27c = 1;
      sStack_278.q = 0;
      sStack_278.v = 0;
    }
    else {
      uVar16 = sStack_260.v[1] << 0x1e | uVar16;
      iStack_27c = 1;
      sStack_278.u = 1 << ((byte)iVar22 & 0x1f);
      uVar33 = (uint)(sStack_230.v[1] << 0x1e | sStack_230.v[0]) >> ((byte)iVar22 & 0x1f);
      iVar22 = 0x1e - iVar22;
      sStack_278.v = 0;
      sStack_278.q = 0;
      do {
        uVar26 = uVar33;
        iVar37 = sStack_278.u;
        iVar29 = sStack_278.v;
        if (iVar34 < 0) {
          iVar34 = -iVar34;
          uVar26 = uVar16;
          iVar37 = sStack_278.q;
          uVar16 = uVar33;
          sStack_278.q = sStack_278.u;
          iVar29 = iStack_27c;
          iStack_27c = sStack_278.v;
        }
        iVar6 = iVar34 + 1;
        if (iVar22 <= iVar34 + 1) {
          iVar6 = iVar22;
        }
        uVar18 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar16 >> 1 & 0x7f] * (char)uVar26) <<
                 (-(char)iVar6 & 0x1fU)) >> (-(char)iVar6 & 0x1fU);
        uVar26 = uVar18 * uVar16 + uVar26;
        sStack_278.q = uVar18 * iVar37 + sStack_278.q;
        uVar33 = -1 << ((byte)iVar22 & 0x1f) | uVar26;
        iVar6 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        bVar21 = (byte)iVar6;
        uVar33 = uVar26 >> (bVar21 & 0x1f);
        sStack_278.u = iVar37 << (bVar21 & 0x1f);
        sStack_278.v = iVar29 << (bVar21 & 0x1f);
        iStack_27c = uVar18 * iVar29 + iStack_27c;
        iVar34 = iVar34 - iVar6;
        iVar22 = iVar22 - iVar6;
      } while (iVar22 != 0);
    }
    uVar16 = (uint)uVar30;
    sStack_278.r = iStack_27c;
    uStack_268 = uVar30;
    secp256k1_modinv32_update_fg_30_var(uVar16,&sStack_260,&sStack_230,&sStack_278);
    if (sStack_260.v[0] == 1) {
      if ((int)uVar16 < 2) {
        return;
      }
      uVar33 = 0;
      uVar32 = 1;
      do {
        uVar33 = uVar33 | sStack_260.v[uVar32];
        uVar32 = uVar32 + 1;
      } while (uVar30 != uVar32);
      if (uVar33 == 0) {
        return;
      }
    }
    uVar33 = uVar16 - 1;
    if (((int)(uVar16 - 2) < 0 || *(int *)((long)&uStack_268 + (long)(int)uVar16 * 4 + 4) != 0) ||
        (&iStack_234)[(int)uVar16] != 0) {
      uVar33 = uVar16;
    }
    iVar17 = iVar17 + 1;
    uVar30 = (ulong)uVar33;
    uVar16 = sStack_260.v[0];
    if (iVar17 == 0x32) {
      return;
    }
  } while( true );
LAB_0016c2f5:
  pcStack_f0 = (code *)0x16c2fa;
  test_modinv32_uint16_cold_5();
LAB_0016c2fa:
  pcStack_f0 = (code *)0x16c2ff;
  test_modinv32_uint16_cold_3();
LAB_0016c2ff:
  pcStack_f0 = (code *)0x16c304;
  test_modinv32_uint16_cold_1();
  psVar25 = out_01;
LAB_0016c304:
  a = psVar25;
  pcStack_f0 = (code *)0x16c309;
  test_modinv32_uint16_cold_6();
  goto LAB_0016c309;
LAB_0016c890:
  pcStack_1d8 = (code *)0x16c895;
  test_modinv64_uint16_cold_5();
  goto LAB_0016c895;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}